

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMDImporter.cpp
# Opt level: O2

void __thiscall
Assimp::MMDImporter::InternReadFile
          (MMDImporter *this,string *file,aiScene *pScene,IOSystem *param_3)

{
  long lVar1;
  ulong uVar2;
  DeadlyImportError *pDVar3;
  PmxModel model;
  istream fileStream;
  filebuf fb;
  
  std::filebuf::filebuf((string *)&fb);
  lVar1 = std::filebuf::open((string *)&fb,(_Ios_Openmode)file);
  if (lVar1 == 0) {
    pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fileStream,
                   "Failed to open file ",file);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&model,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fileStream,
                   ".");
    DeadlyImportError::DeadlyImportError(pDVar3,(string *)&model);
    __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  std::istream::istream(&fileStream,(streambuf *)&fb);
  std::istream::seekg((long)&fileStream,_S_beg);
  uVar2 = std::istream::tellg();
  std::istream::seekg((long)&fileStream,_S_beg);
  if (0x12f < uVar2) {
    model.model_name._M_dataplus._M_p = (pointer)&model.model_name.field_2;
    model.version = 0.0;
    model.setting.encoding = '\0';
    model.setting.uv = '\0';
    model.setting.vertex_index_size = '\0';
    model.setting.texture_index_size = '\0';
    model.setting.material_index_size = '\0';
    model.setting.bone_index_size = '\0';
    model.setting.morph_index_size = '\0';
    model.setting.rigidbody_index_size = '\0';
    model.model_name._M_string_length = 0;
    model.model_name.field_2._M_local_buf[0] = '\0';
    model.model_english_name._M_dataplus._M_p = (pointer)&model.model_english_name.field_2;
    model.model_english_name._M_string_length = 0;
    model.model_english_name.field_2._M_local_buf[0] = '\0';
    model.model_comment._M_dataplus._M_p = (pointer)&model.model_comment.field_2;
    model.model_comment._M_string_length = 0;
    model.model_comment.field_2._M_local_buf[0] = '\0';
    model.model_english_comment._M_dataplus._M_p = (pointer)&model.model_english_comment.field_2;
    model.model_english_comment._M_string_length = 0;
    model.model_english_comment.field_2._M_local_buf[0] = '\0';
    model.vertex_count = 0;
    model.vertices._M_t.
    super___uniq_ptr_impl<pmx::PmxVertex,_std::default_delete<pmx::PmxVertex[]>_>._M_t.
    super__Tuple_impl<0UL,_pmx::PmxVertex_*,_std::default_delete<pmx::PmxVertex[]>_>.
    super__Head_base<0UL,_pmx::PmxVertex_*,_false>._M_head_impl =
         (__uniq_ptr_data<pmx::PmxVertex,_std::default_delete<pmx::PmxVertex[]>,_true,_true>)
         (__uniq_ptr_impl<pmx::PmxVertex,_std::default_delete<pmx::PmxVertex[]>_>)0x0;
    model.index_count = 0;
    model.indices._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
    super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>.
    _M_head_impl = (__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)
                   (__uniq_ptr_impl<int,_std::default_delete<int[]>_>)0x0;
    model.texture_count = 0;
    model.textures._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>[]>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>[]>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>[]>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>[]>_>
            )0x0;
    model.material_count = 0;
    model.materials._M_t.
    super___uniq_ptr_impl<pmx::PmxMaterial,_std::default_delete<pmx::PmxMaterial[]>_>._M_t.
    super__Tuple_impl<0UL,_pmx::PmxMaterial_*,_std::default_delete<pmx::PmxMaterial[]>_>.
    super__Head_base<0UL,_pmx::PmxMaterial_*,_false>._M_head_impl =
         (__uniq_ptr_data<pmx::PmxMaterial,_std::default_delete<pmx::PmxMaterial[]>,_true,_true>)
         (__uniq_ptr_impl<pmx::PmxMaterial,_std::default_delete<pmx::PmxMaterial[]>_>)0x0;
    model.bone_count = 0;
    model.bones._M_t.super___uniq_ptr_impl<pmx::PmxBone,_std::default_delete<pmx::PmxBone[]>_>._M_t.
    super__Tuple_impl<0UL,_pmx::PmxBone_*,_std::default_delete<pmx::PmxBone[]>_>.
    super__Head_base<0UL,_pmx::PmxBone_*,_false>._M_head_impl =
         (__uniq_ptr_data<pmx::PmxBone,_std::default_delete<pmx::PmxBone[]>,_true,_true>)
         (__uniq_ptr_impl<pmx::PmxBone,_std::default_delete<pmx::PmxBone[]>_>)0x0;
    model.morph_count = 0;
    model.morphs._M_t.super___uniq_ptr_impl<pmx::PmxMorph,_std::default_delete<pmx::PmxMorph[]>_>.
    _M_t.super__Tuple_impl<0UL,_pmx::PmxMorph_*,_std::default_delete<pmx::PmxMorph[]>_>.
    super__Head_base<0UL,_pmx::PmxMorph_*,_false>._M_head_impl =
         (__uniq_ptr_data<pmx::PmxMorph,_std::default_delete<pmx::PmxMorph[]>,_true,_true>)
         (__uniq_ptr_impl<pmx::PmxMorph,_std::default_delete<pmx::PmxMorph[]>_>)0x0;
    model.frame_count = 0;
    model.frames._M_t.super___uniq_ptr_impl<pmx::PmxFrame,_std::default_delete<pmx::PmxFrame[]>_>.
    _M_t.super__Tuple_impl<0UL,_pmx::PmxFrame_*,_std::default_delete<pmx::PmxFrame[]>_>.
    super__Head_base<0UL,_pmx::PmxFrame_*,_false>._M_head_impl =
         (__uniq_ptr_data<pmx::PmxFrame,_std::default_delete<pmx::PmxFrame[]>,_true,_true>)
         (__uniq_ptr_impl<pmx::PmxFrame,_std::default_delete<pmx::PmxFrame[]>_>)0x0;
    model.rigid_body_count = 0;
    model.rigid_bodies._M_t.
    super___uniq_ptr_impl<pmx::PmxRigidBody,_std::default_delete<pmx::PmxRigidBody[]>_>._M_t.
    super__Tuple_impl<0UL,_pmx::PmxRigidBody_*,_std::default_delete<pmx::PmxRigidBody[]>_>.
    super__Head_base<0UL,_pmx::PmxRigidBody_*,_false>._M_head_impl =
         (__uniq_ptr_data<pmx::PmxRigidBody,_std::default_delete<pmx::PmxRigidBody[]>,_true,_true>)
         (__uniq_ptr_impl<pmx::PmxRigidBody,_std::default_delete<pmx::PmxRigidBody[]>_>)0x0;
    model.joint_count = 0;
    model.joints._M_t.super___uniq_ptr_impl<pmx::PmxJoint,_std::default_delete<pmx::PmxJoint[]>_>.
    _M_t.super__Tuple_impl<0UL,_pmx::PmxJoint_*,_std::default_delete<pmx::PmxJoint[]>_>.
    super__Head_base<0UL,_pmx::PmxJoint_*,_false>._M_head_impl =
         (__uniq_ptr_data<pmx::PmxJoint,_std::default_delete<pmx::PmxJoint[]>,_true,_true>)
         (__uniq_ptr_impl<pmx::PmxJoint,_std::default_delete<pmx::PmxJoint[]>_>)0x0;
    model.soft_body_count = 0;
    model.soft_bodies._M_t.
    super___uniq_ptr_impl<pmx::PmxSoftBody,_std::default_delete<pmx::PmxSoftBody[]>_>._M_t.
    super__Tuple_impl<0UL,_pmx::PmxSoftBody_*,_std::default_delete<pmx::PmxSoftBody[]>_>.
    super__Head_base<0UL,_pmx::PmxSoftBody_*,_false>._M_head_impl =
         (__uniq_ptr_data<pmx::PmxSoftBody,_std::default_delete<pmx::PmxSoftBody[]>,_true,_true>)
         (__uniq_ptr_impl<pmx::PmxSoftBody,_std::default_delete<pmx::PmxSoftBody[]>_>)0x0;
    pmx::PmxModel::Read(&model,&fileStream);
    CreateDataFromImport(this,&model,pScene);
    pmx::PmxModel::~PmxModel(&model);
    std::istream::~istream(&fileStream);
    std::filebuf::~filebuf(&fb);
    return;
  }
  pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&model,file,
                 " is too small.");
  DeadlyImportError::DeadlyImportError(pDVar3,(string *)&model);
  __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void MMDImporter::InternReadFile(const std::string &file, aiScene *pScene,
                                 IOSystem * /*pIOHandler*/) {
  // Read file by istream
  std::filebuf fb;
  if (!fb.open(file, std::ios::in | std::ios::binary)) {
    throw DeadlyImportError("Failed to open file " + file + ".");
  }

  std::istream fileStream(&fb);

  // Get the file-size and validate it, throwing an exception when fails
  fileStream.seekg(0, fileStream.end);
  size_t fileSize = static_cast<size_t>(fileStream.tellg());
  fileStream.seekg(0, fileStream.beg);

  if (fileSize < sizeof(pmx::PmxModel)) {
    throw DeadlyImportError(file + " is too small.");
  }

  pmx::PmxModel model;
  model.Read(&fileStream);

  CreateDataFromImport(&model, pScene);
}